

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall GroundScene::GroundScene(GroundScene *this,int tx,int ty)

{
  int local_2c;
  int local_28;
  int j;
  int i;
  int ty_local;
  int tx_local;
  GroundScene *this_local;
  
  std::vector<Object_*,_std::allocator<Object_*>_>::vector(&this->objects);
  this->x = tx;
  this->y = ty;
  this->w = 0x4b;
  this->h = 0x25;
  this->selectX = 0;
  this->selectY = 0;
  this->count = 0;
  initSun(this);
  this->sunVectorN = 0x32;
  this->randSortCount = 0;
  this->isRandSort = false;
  this->score = 0;
  this->level = 0;
  this->genZombieCount = 0;
  this->genZombieSpeed = 0;
  this->genZombieNumber = 0;
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    this->weedKiller[local_28] = true;
    for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
      this->plants[local_28][local_2c] = (Plant *)0x0;
      this->specialColor[local_28][local_2c] = 0xf;
    }
  }
  return;
}

Assistant:

GroundScene::GroundScene(int tx, int ty){
	x = tx; y = ty; w = GSW; h = GSH;
	selectX = 0;
	selectY = 0;
	count = 0;
	initSun();
	sunVectorN = GSBH*GSBW;
	randSortCount = 0;
	isRandSort = 0;
	score = 0;
	level = 0;
	genZombieCount = 0;
	genZombieSpeed = 0;
	genZombieNumber = 0;
	for(int i = 0; i < GSBH; ++i){
		weedKiller[i] = 1;
		for(int j = 0; j < GSBW; ++j){
			plants[i][j] = NULL;
			specialColor[i][j] = WHITE;
		}
	}

	/* objects.push_back(new Suns(x+1+3, y+1)); */
	/* objects.push_back(new SunFlower(x+1+3+1, y+1+2)); */
	/* objects.push_back(new PeaShooter(x+1+3+1, y+1+2+BLOCKW)); */
	/* objects.push_back(new NewsZombie(x+1+3+7*BLOCKW+1, y+1+2)); */
	/* objects.push_back(new NewsZombie(x+1+3+8*BLOCKW+1, y+1+2)); */
	/* objects.push_back(new DoorZombie(x+1+3+8*BLOCKW+1, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new DancingZombie(x+1+3+8*BLOCKW+1, y+1+2+0*BLOCKW)); */
	/* weedKiller[1] = 0; */
	/* objects.push_back(new BucketZombie(x+1+3+6*BLOCKW+1, y+1+2+0*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+6*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+7*BLOCKW+1+2, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+6*BLOCKW+1+2, y+1+2+0*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+6*BLOCKW+1+2, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+8*BLOCKW+1, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+8*BLOCKW+1+2, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+7*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+8*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* genPlant(4, 1, OBJ_TYPE_POTATOMINE); */
	/* genPlant(0, 1, OBJ_TYPE_SNOWPEA); */
	/* genPlant(0, 1, OBJ_TYPE_MELONPULT); */
	/* genPlant(6, 0, OBJ_TYPE_SPIKEWEED); */
	/* genPlant(6, 2, OBJ_TYPE_WALLNUT); */
	/* genPlant(6, 1, OBJ_TYPE_GARLIC); */
	/* genPlant(0, 0, OBJ_TYPE_PEASHOOTER); */
	/* genPlant(0, 2, OBJ_TYPE_SNOWPEA); */
	/* genPlant(6, 1, OBJ_TYPE_SPIKEWEED); */
	/* genPlant(0, 2, OBJ_TYPE_SNOWMELON); */
	/* genPlant(0, 0, OBJ_TYPE_PEASHOOTER); */
}